

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O3

MPP_RET __thiscall Mpp::put_frame(Mpp *this,MppFrame frame)

{
  MppTask *task;
  MppPollType MVar1;
  Kmpp *pKVar2;
  _func_MPP_RET_Kmpp_ptr_MppFrame *UNRECOVERED_JUMPTABLE;
  MPP_RET MVar3;
  RK_S32 RVar4;
  RK_S64 RVar5;
  MppStopwatch stopwatch;
  MppMeta meta;
  int __timeout;
  undefined8 in_RCX;
  char *pcVar6;
  MppTask pvVar7;
  ulong uVar8;
  MppBuffer md_info_buf;
  MppPacket packet;
  MppBuffer local_40;
  MppPacket local_38;
  
  if (this->mInitDone == 0) {
    return MPP_ERR_INIT;
  }
  if (((byte)mpp_debug & 2) != 0) {
    RVar5 = mpp_frame_get_pts(frame);
    in_RCX = 0;
    _mpp_log_l(4,"mpp","%p input frame pts %lld\n",(char *)0x0,this,RVar5);
  }
  pKVar2 = this->mKmpp;
  if (((pKVar2 != (Kmpp *)0x0) && (pKVar2->mApi != (KmppOps *)0x0)) &&
     (UNRECOVERED_JUMPTABLE = pKVar2->mApi->put_frame,
     UNRECOVERED_JUMPTABLE != (_func_MPP_RET_Kmpp_ptr_MppFrame *)0x0)) {
    MVar3 = (*UNRECOVERED_JUMPTABLE)(pKVar2,frame);
    return MVar3;
  }
  if (this->mInputTimeout == MPP_POLL_NON_BLOCK) {
    set_io_mode(this,MPP_IO_MODE_NORMAL);
    MVar3 = put_frame_async(this,frame);
    return MVar3;
  }
  if (((byte)mpp_debug & 1) == 0) {
    stopwatch = (MppStopwatch)0x0;
  }
  else {
    mpp_frame_set_stopwatch_enable(frame,1);
    stopwatch = mpp_frame_get_stopwatch(frame);
  }
  mpp_stopwatch_record(stopwatch,(char *)0x0);
  mpp_stopwatch_record(stopwatch,"put frame start");
  __timeout = (int)in_RCX;
  task = &this->mInputTask;
  pvVar7 = this->mInputTask;
  if (pvVar7 == (MppTask)0x0) {
    mpp_stopwatch_record(stopwatch,"input port user poll");
    MVar3 = poll(this,(pollfd *)0x0,(ulong)(uint)this->mInputTimeout,(int)in_RCX);
    if (MPP_NOK < MVar3) {
      mpp_stopwatch_record(stopwatch,"input port user dequeue");
      MVar3 = dequeue(this,MPP_PORT_INPUT,task);
      pvVar7 = this->mInputTask;
      __timeout = (int)CONCAT71((int7)((ulong)in_RCX >> 8),pvVar7 == (MppTask)0x0 || MVar3 != MPP_OK
                               );
      if (pvVar7 == (MppTask)0x0 || MVar3 != MPP_OK) {
        _mpp_log_l(4,"mpp","dequeue on set ret %d task %p\n","put_frame",(ulong)(uint)MVar3);
        goto LAB_00138875;
      }
      goto LAB_00138836;
    }
    MVar1 = this->mInputTimeout;
    if (MVar1 == MPP_POLL_NON_BLOCK) goto LAB_00138875;
    pcVar6 = "poll on set timeout %d ret %d\n";
LAB_001389c3:
    _mpp_log_l(4,"mpp",pcVar6,"put_frame",(ulong)(uint)MVar1,(ulong)(uint)MVar3);
  }
  else {
LAB_00138836:
    MVar3 = mpp_task_meta_set_frame(pvVar7,KEY_INPUT_FRAME,frame);
    if (MVar3 == MPP_OK) {
      RVar4 = mpp_frame_has_meta(frame);
      if (RVar4 == 0) {
LAB_00138a29:
        mpp_ops_enc_put_frm(this->mDump,frame);
        mpp_stopwatch_record(stopwatch,"input port user enqueue");
        MVar3 = enqueue(this,MPP_PORT_INPUT,this->mInputTask);
        if (MVar3 == MPP_OK) {
          this->mInputTask = (MppTask)0x0;
          mpp_stopwatch_record(stopwatch,"input port user poll");
          MVar3 = poll(this,(pollfd *)0x0,(ulong)(uint)this->mInputTimeout,__timeout);
          if (MVar3 < MPP_OK) {
            MVar1 = this->mInputTimeout;
            if (MVar1 == MPP_POLL_NON_BLOCK) goto LAB_00138875;
            pcVar6 = "poll on get timeout %d ret %d\n";
            goto LAB_001389c3;
          }
          mpp_stopwatch_record(stopwatch,"input port user dequeue");
          MVar3 = dequeue(this,MPP_PORT_INPUT,task);
          if (MVar3 == MPP_OK) {
            pvVar7 = *task;
            if (pvVar7 == (MppTask)0x0) {
              MVar3 = MPP_OK;
              _mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,"mInputTask",
                         "put_frame",0x30a);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00138bac;
              pvVar7 = *task;
              if (pvVar7 == (MppTask)0x0) goto LAB_00138875;
            }
            local_38 = (MppFrame)0x0;
            mpp_task_meta_get_frame(pvVar7,KEY_INPUT_FRAME,&local_38);
            if ((local_38 != frame) &&
               (_mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,"frm_out == frame",
                           "put_frame",0x30f), (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_00138bac:
              abort();
            }
            MVar3 = MPP_OK;
            goto LAB_00138875;
          }
          uVar8 = (ulong)(uint)MVar3;
          pcVar6 = "dequeue on get ret %d\n";
        }
        else {
          uVar8 = (ulong)(uint)MVar3;
          pcVar6 = "enqueue ret %d\n";
        }
      }
      else {
        meta = mpp_frame_get_meta(frame);
        local_38 = (MppPacket)0x0;
        local_40 = (MppBuffer)0x0;
        mpp_meta_get_packet(meta,KEY_OUTPUT_PACKET,&local_38);
        if ((local_38 == (MppPacket)0x0) ||
           (MVar3 = mpp_task_meta_set_packet(*task,KEY_OUTPUT_PACKET,local_38), MVar3 == MPP_OK)) {
          mpp_meta_get_buffer(meta,KEY_MOTION_INFO,&local_40);
          if ((local_40 == (MppBuffer)0x0) ||
             (MVar3 = mpp_task_meta_set_buffer(*task,KEY_MOTION_INFO,local_40), MVar3 == MPP_OK))
          goto LAB_00138a29;
          uVar8 = (ulong)(uint)MVar3;
          pcVar6 = "set output motion dection info ret %d\n";
        }
        else {
          uVar8 = (ulong)(uint)MVar3;
          pcVar6 = "set output packet to task ret %d\n";
        }
      }
    }
    else {
      uVar8 = (ulong)(uint)MVar3;
      pcVar6 = "set input frame to task ret %d\n";
    }
    MVar3 = (MPP_RET)uVar8;
    _mpp_log_l(4,"mpp",pcVar6,"put_frame",uVar8);
  }
LAB_00138875:
  mpp_stopwatch_record(stopwatch,"put_frame finish");
  mpp_frame_set_stopwatch_enable(frame,0);
  return MVar3;
}

Assistant:

MPP_RET Mpp::put_frame(MppFrame frame)
{
    if (!mInitDone)
        return MPP_ERR_INIT;

    mpp_dbg_pts("%p input frame pts %lld\n", this, mpp_frame_get_pts(frame));

    if (mKmpp && mKmpp->mApi && mKmpp->mApi->put_frame)
        return mKmpp->mApi->put_frame(mKmpp, frame);

    if (mInputTimeout == MPP_POLL_NON_BLOCK) {
        set_io_mode(MPP_IO_MODE_NORMAL);
        return put_frame_async(frame);
    }

    MPP_RET ret = MPP_NOK;
    MppStopwatch stopwatch = NULL;

    if (mpp_debug & MPP_DBG_TIMING) {
        mpp_frame_set_stopwatch_enable(frame, 1);
        stopwatch = mpp_frame_get_stopwatch(frame);
    }

    mpp_stopwatch_record(stopwatch, NULL);
    mpp_stopwatch_record(stopwatch, "put frame start");

    if (mInputTask == NULL) {
        mpp_stopwatch_record(stopwatch, "input port user poll");
        /* poll input port for valid task */
        ret = poll(MPP_PORT_INPUT, mInputTimeout);
        if (ret < 0) {
            if (mInputTimeout)
                mpp_log_f("poll on set timeout %d ret %d\n", mInputTimeout, ret);
            goto RET;
        }

        /* dequeue task for setup */
        mpp_stopwatch_record(stopwatch, "input port user dequeue");
        ret = dequeue(MPP_PORT_INPUT, &mInputTask);
        if (ret || NULL == mInputTask) {
            mpp_log_f("dequeue on set ret %d task %p\n", ret, mInputTask);
            goto RET;
        }
    }

    mpp_assert(mInputTask);

    /* setup task */
    ret = mpp_task_meta_set_frame(mInputTask, KEY_INPUT_FRAME, frame);
    if (ret) {
        mpp_log_f("set input frame to task ret %d\n", ret);
        goto RET;
    }

    if (mpp_frame_has_meta(frame)) {
        MppMeta meta = mpp_frame_get_meta(frame);
        MppPacket packet = NULL;
        MppBuffer md_info_buf = NULL;

        mpp_meta_get_packet(meta, KEY_OUTPUT_PACKET, &packet);
        if (packet) {
            ret = mpp_task_meta_set_packet(mInputTask, KEY_OUTPUT_PACKET, packet);
            if (ret) {
                mpp_log_f("set output packet to task ret %d\n", ret);
                goto RET;
            }
        }

        mpp_meta_get_buffer(meta, KEY_MOTION_INFO, &md_info_buf);
        if (md_info_buf) {
            ret = mpp_task_meta_set_buffer(mInputTask, KEY_MOTION_INFO, md_info_buf);
            if (ret) {
                mpp_log_f("set output motion dection info ret %d\n", ret);
                goto RET;
            }
        }
    }

    // dump input
    mpp_ops_enc_put_frm(mDump, frame);

    /* enqueue valid task to encoder */
    mpp_stopwatch_record(stopwatch, "input port user enqueue");
    ret = enqueue(MPP_PORT_INPUT, mInputTask);
    if (ret) {
        mpp_log_f("enqueue ret %d\n", ret);
        goto RET;
    }

    mInputTask = NULL;
    /* wait enqueued task finished */
    mpp_stopwatch_record(stopwatch, "input port user poll");
    ret = poll(MPP_PORT_INPUT, mInputTimeout);
    if (ret < 0) {
        if (mInputTimeout)
            mpp_log_f("poll on get timeout %d ret %d\n", mInputTimeout, ret);
        goto RET;
    }

    /* get previous enqueued task back */
    mpp_stopwatch_record(stopwatch, "input port user dequeue");
    ret = dequeue(MPP_PORT_INPUT, &mInputTask);
    if (ret) {
        mpp_log_f("dequeue on get ret %d\n", ret);
        goto RET;
    }

    mpp_assert(mInputTask);
    if (mInputTask) {
        MppFrame frm_out = NULL;

        mpp_task_meta_get_frame(mInputTask, KEY_INPUT_FRAME, &frm_out);
        mpp_assert(frm_out == frame);
    }

RET:
    mpp_stopwatch_record(stopwatch, "put_frame finish");
    mpp_frame_set_stopwatch_enable(frame, 0);
    return ret;
}